

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

ostream * std::operator<<(ostream *ofs,Extent v)

{
  Extent e;
  undefined1 auVar1 [12];
  string local_30 [32];
  ostream *local_10;
  ostream *ofs_local;
  
  e.upper._M_elems._4_8_ = ofs;
  auVar1 = SUB1612(v._8_16_,0);
  e.lower._M_elems[0] = (float)auVar1._0_4_;
  e.lower._M_elems[1] = (float)auVar1._4_4_;
  e.lower._M_elems[2] = (float)auVar1._8_4_;
  e.upper._M_elems[0] = (float)SUB164(v._8_16_,0xc);
  local_10 = ofs;
  tinyusdz::to_string_abi_cxx11_(e);
  std::operator<<(ofs,local_30);
  std::__cxx11::string::~string(local_30);
  return local_10;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const tinyusdz::Extent v) {
  ofs << to_string(v);

  return ofs;
}